

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::CanReplaceVariable
          (ScalarReplacementPass *this,Instruction *varInst)

{
  IRContext *this_00;
  DefUseManager *this_01;
  bool bVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  VariableStats stats;
  VariableStats local_20;
  
  if (varInst->opcode_ != OpVariable) {
    __assert_fail("varInst->opcode() == spv::Op::OpVariable",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                  ,0x25d,
                  "bool spvtools::opt::ScalarReplacementPass::CanReplaceVariable(const Instruction *) const"
                 );
  }
  uVar2 = (varInst->has_result_id_ & 1) + 1;
  if (varInst->has_type_id_ == false) {
    uVar2 = (uint)varInst->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(varInst,uVar2);
  if (uVar2 == 7) {
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar2 = 0;
    if (varInst->has_type_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(varInst,0);
    }
    pIVar3 = analysis::DefUseManager::GetDef(this_01,uVar2);
    bVar1 = CheckTypeAnnotations(this,pIVar3);
    if (bVar1) {
      pIVar3 = GetStorageType(this,varInst);
      bVar1 = CheckType(this,pIVar3);
      if ((bVar1) && (bVar1 = CheckAnnotations(this,varInst), bVar1)) {
        local_20.num_partial_accesses = 0;
        local_20.num_full_accesses = 0;
        bVar1 = CheckUses(this,varInst,&local_20);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ScalarReplacementPass::CanReplaceVariable(
    const Instruction* varInst) const {
  assert(varInst->opcode() == spv::Op::OpVariable);

  // Can only replace function scope variables.
  if (spv::StorageClass(varInst->GetSingleWordInOperand(0u)) !=
      spv::StorageClass::Function) {
    return false;
  }

  if (!CheckTypeAnnotations(get_def_use_mgr()->GetDef(varInst->type_id()))) {
    return false;
  }

  const Instruction* typeInst = GetStorageType(varInst);
  if (!CheckType(typeInst)) {
    return false;
  }

  if (!CheckAnnotations(varInst)) {
    return false;
  }

  if (!CheckUses(varInst)) {
    return false;
  }

  return true;
}